

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool slang::ast::Bitstream::canBeSource
               (Type *target,StreamingConcatenationExpression *rhs,SourceLocation assignLoc,
               ASTContext *context)

{
  bool bVar1;
  size_t arg;
  size_t arg_00;
  Diagnostic *pDVar2;
  
  bVar1 = Type::isBitstreamType(target,true);
  if (bVar1) {
    if (((context->flags).m_bits & 2) != 0) {
      return true;
    }
    bVar1 = Type::isFixedSize(target);
    if (!bVar1) {
      return true;
    }
    arg = Type::bitstreamWidth(target);
    arg_00 = StreamingConcatenationExpression::bitstreamWidth(rhs);
    if (arg_00 <= arg) {
      return true;
    }
    pDVar2 = ASTContext::addDiag(context,(DiagCode)0x2b0007,assignLoc);
    pDVar2 = Diagnostic::operator<<(pDVar2,arg);
    pDVar2 = Diagnostic::operator<<(pDVar2,arg_00);
  }
  else {
    pDVar2 = ASTContext::addDiag(context,(DiagCode)0x2e0007,assignLoc);
    pDVar2 = ast::operator<<(pDVar2,target);
  }
  Diagnostic::operator<<(pDVar2,(rhs->super_Expression).sourceRange);
  return false;
}

Assistant:

bool Bitstream::canBeSource(const Type& target, const StreamingConcatenationExpression& rhs,
                            SourceLocation assignLoc, const ASTContext& context) {
    if (!target.isBitstreamType(true)) {
        context.addDiag(diag::BadStreamTargetType, assignLoc) << target << rhs.sourceRange;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch
    if (!target.isFixedSize())
        return true; // Sizes checked at constant evaluation or runtime

    auto targetWidth = target.bitstreamWidth();
    auto sourceWidth = rhs.bitstreamWidth();
    if (targetWidth < sourceWidth) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignLoc) << targetWidth << sourceWidth;
        diag << rhs.sourceRange;
        return false;
    }

    return true;
}